

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::btToLevel(SAT *this,int level)

{
  int iVar1;
  vec<Clause_*> *pvVar2;
  Clause **ppCVar3;
  uint index;
  int in_ESI;
  vec<vec<Lit>_> *in_RDI;
  SAT *unaff_retaddr;
  int i;
  int l;
  int in_stack_0000002c;
  Engine *in_stack_00000030;
  uint in_stack_ffffffffffffffdc;
  uint local_14;
  uint local_10;
  vec<vec<Lit>_> *t;
  
  t = in_RDI;
  iVar1 = decisionLevel((SAT *)0x292c7c);
  if (in_ESI < iVar1) {
    local_10 = vec<vec<Lit>_>::size(in_RDI + 0xc);
    while (index = local_10 - 1, in_ESI + 1 < (int)local_10) {
      vec<vec<Lit>_>::operator[](in_RDI + 0xc,index);
      untrailToPos(unaff_retaddr,(vec<Lit> *)t,in_ESI);
      pvVar2 = vec<vec<Clause_*>_>::operator[]((vec<vec<Clause_*>_> *)(in_RDI + 0xe),index);
      local_14 = vec<Clause_*>::size(pvVar2);
      while (local_10 = index, local_14 != 0) {
        pvVar2 = vec<vec<Clause_*>_>::operator[]((vec<vec<Clause_*>_> *)(in_RDI + 0xe),index);
        ppCVar3 = vec<Clause_*>::operator[](pvVar2,local_14 - 1);
        free(*ppCVar3);
        local_14 = local_14 - 1;
      }
    }
    vec<vec<Lit>_>::resize(in_RDI,in_stack_ffffffffffffffdc);
    iVar1 = (int)((ulong)t >> 0x20);
    vec<int>::resize((vec<int> *)(in_RDI + 0xd),in_ESI + 1);
    vec<vec<Clause_*>_>::resize((vec<vec<Clause_*>_> *)in_RDI,in_stack_ffffffffffffffdc);
    Engine::btToLevel(in_stack_00000030,in_stack_0000002c);
    if ((so.mip & 1U) != 0) {
      MIP::btToLevel((MIP *)unaff_retaddr,iVar1);
    }
  }
  return;
}

Assistant:

void SAT::btToLevel(int level) {
#if DEBUG_VERBOSE
	std::cerr << "SAT::btToLevel( " << level << ")\n";
#endif
	if (decisionLevel() <= level) {
		return;
	}

	for (int l = trail.size(); l-- > level + 1;) {
		untrailToPos(trail[l], 0);
		for (int i = rtrail[l].size(); (i--) != 0;) {
			free(rtrail[l][i]);
		}
	}
	trail.resize(level + 1);
	qhead.resize(level + 1);
	rtrail.resize(level + 1);

	engine.btToLevel(level);
	if (so.mip) {
		mip->btToLevel(level);
	}
}